

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  int iVar1;
  int res;
  TValue *r_local;
  TValue *l_local;
  lua_State *L_local;
  
  if (((l->tt_ & 0xf) == 3) && ((r->tt_ & 0xf) == 3)) {
    L_local._4_4_ = LEnum(l,r);
  }
  else if (((l->tt_ & 0xf) == 4) && ((r->tt_ & 0xf) == 4)) {
    if ((l->tt_ & 0xf) != 4) {
      __assert_fail("(((((((l))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ca,"int luaV_lessequal(lua_State *, const TValue *, const TValue *)");
    }
    if ((((l->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((l)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ca,"int luaV_lessequal(lua_State *, const TValue *, const TValue *)");
    }
    if ((r->tt_ & 0xf) != 4) {
      __assert_fail("(((((((r))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ca,"int luaV_lessequal(lua_State *, const TValue *, const TValue *)");
    }
    if ((((r->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((r)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ca,"int luaV_lessequal(lua_State *, const TValue *, const TValue *)");
    }
    iVar1 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
    L_local._4_4_ = (uint)(iVar1 < 1);
  }
  else {
    L_local._4_4_ = luaT_callorderTM(L,l,r,TM_LE);
    if ((int)L_local._4_4_ < 0) {
      L->ci->callstatus = L->ci->callstatus | 0x80;
      iVar1 = luaT_callorderTM(L,r,l,TM_LT);
      L->ci->callstatus = L->ci->callstatus ^ 0x80;
      if (iVar1 < 0) {
        luaG_ordererror(L,l,r);
      }
      L_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
  }
  return L_local._4_4_;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LEnum(l, r);
  else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
    return l_strcmp(tsvalue(l), tsvalue(r)) <= 0;
  else if ((res = luaT_callorderTM(L, l, r, TM_LE)) >= 0)  /* try 'le' */
    return res;
  else {  /* try 'lt': */
    L->ci->callstatus |= CIST_LEQ;  /* mark it is doing 'lt' for 'le' */
    res = luaT_callorderTM(L, r, l, TM_LT);
    L->ci->callstatus ^= CIST_LEQ;  /* clear mark */
    if (res < 0)
      luaG_ordererror(L, l, r);
    return !res;  /* result is negated */
  }
}